

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_viewport_array(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_viewport_array != 0) {
    glad_glViewportArrayvNV = (PFNGLVIEWPORTARRAYVNVPROC)(*load)("glViewportArrayvNV");
    glad_glViewportIndexedfNV = (PFNGLVIEWPORTINDEXEDFNVPROC)(*load)("glViewportIndexedfNV");
    glad_glViewportIndexedfvNV = (PFNGLVIEWPORTINDEXEDFVNVPROC)(*load)("glViewportIndexedfvNV");
    glad_glScissorArrayvNV = (PFNGLSCISSORARRAYVNVPROC)(*load)("glScissorArrayvNV");
    glad_glScissorIndexedNV = (PFNGLSCISSORINDEXEDNVPROC)(*load)("glScissorIndexedNV");
    glad_glScissorIndexedvNV = (PFNGLSCISSORINDEXEDVNVPROC)(*load)("glScissorIndexedvNV");
    glad_glDepthRangeArrayfvNV = (PFNGLDEPTHRANGEARRAYFVNVPROC)(*load)("glDepthRangeArrayfvNV");
    glad_glDepthRangeIndexedfNV = (PFNGLDEPTHRANGEINDEXEDFNVPROC)(*load)("glDepthRangeIndexedfNV");
    glad_glGetFloati_vNV = (PFNGLGETFLOATI_VNVPROC)(*load)("glGetFloati_vNV");
    glad_glEnableiNV = (PFNGLENABLEINVPROC)(*load)("glEnableiNV");
    glad_glDisableiNV = (PFNGLDISABLEINVPROC)(*load)("glDisableiNV");
    glad_glIsEnablediNV = (PFNGLISENABLEDINVPROC)(*load)("glIsEnablediNV");
  }
  return;
}

Assistant:

static void load_GL_NV_viewport_array(GLADloadproc load) {
	if(!GLAD_GL_NV_viewport_array) return;
	glad_glViewportArrayvNV = (PFNGLVIEWPORTARRAYVNVPROC)load("glViewportArrayvNV");
	glad_glViewportIndexedfNV = (PFNGLVIEWPORTINDEXEDFNVPROC)load("glViewportIndexedfNV");
	glad_glViewportIndexedfvNV = (PFNGLVIEWPORTINDEXEDFVNVPROC)load("glViewportIndexedfvNV");
	glad_glScissorArrayvNV = (PFNGLSCISSORARRAYVNVPROC)load("glScissorArrayvNV");
	glad_glScissorIndexedNV = (PFNGLSCISSORINDEXEDNVPROC)load("glScissorIndexedNV");
	glad_glScissorIndexedvNV = (PFNGLSCISSORINDEXEDVNVPROC)load("glScissorIndexedvNV");
	glad_glDepthRangeArrayfvNV = (PFNGLDEPTHRANGEARRAYFVNVPROC)load("glDepthRangeArrayfvNV");
	glad_glDepthRangeIndexedfNV = (PFNGLDEPTHRANGEINDEXEDFNVPROC)load("glDepthRangeIndexedfNV");
	glad_glGetFloati_vNV = (PFNGLGETFLOATI_VNVPROC)load("glGetFloati_vNV");
	glad_glEnableiNV = (PFNGLENABLEINVPROC)load("glEnableiNV");
	glad_glDisableiNV = (PFNGLDISABLEINVPROC)load("glDisableiNV");
	glad_glIsEnablediNV = (PFNGLISENABLEDINVPROC)load("glIsEnablediNV");
}